

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O1

int tidyCleanAndRepair(TidyDoc tdoc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Bool wantName;
  Bool BVar10;
  int iVar11;
  uint uVar12;
  Node *pNVar13;
  char *__s1;
  AttVal *pAVar14;
  tmbstr ptVar15;
  TidyDocImpl *impl_1;
  TidyDocImpl *impl;
  
  if (tdoc != (TidyDoc)0x0) {
    if (tdoc[0x4c]._opaque == 0) {
      iVar11 = tdoc[0x92]._opaque;
      iVar1 = tdoc[0x60]._opaque;
      iVar2 = tdoc[0x5c]._opaque;
      iVar3 = tdoc[0x5e]._opaque;
      iVar4 = tdoc[100]._opaque;
      iVar5 = tdoc[0x52]._opaque;
      iVar6 = tdoc[0x4e]._opaque;
      iVar7 = tdoc[0x50]._opaque;
      iVar8 = tdoc[0x54]._opaque;
      iVar9 = tdoc[0x94]._opaque;
      wantName = tdoc[0xd6]._opaque;
      if (tdoc[0xca]._opaque != 0) {
        prvTidyNestedEmphasis((TidyDocImpl *)tdoc,(Node *)tdoc);
      }
      prvTidyList2BQ((TidyDocImpl *)tdoc,(Node *)tdoc);
      prvTidyBQ2Div((TidyDocImpl *)tdoc,(Node *)tdoc);
      if (iVar1 != 0) {
        prvTidyEmFromI((TidyDocImpl *)tdoc,(Node *)tdoc);
      }
      if (iVar11 != 0) {
        BVar10 = prvTidyIsWord2000((TidyDocImpl *)tdoc);
        if (BVar10 != no) {
          prvTidyDropSections((TidyDocImpl *)tdoc,(Node *)tdoc);
          prvTidyCleanWord2000((TidyDocImpl *)tdoc,(Node *)tdoc);
          prvTidyDropEmptyElements((TidyDocImpl *)tdoc,(Node *)tdoc);
        }
      }
      if (iVar2 != 0 || iVar4 != 0) {
        prvTidyCleanDocument((TidyDocImpl *)tdoc);
      }
      if (iVar3 != 0) {
        prvTidyCleanGoogleDocument((TidyDocImpl *)tdoc);
      }
      if ((*(long *)(tdoc + 0x28) != 0) && (*(long *)(tdoc + 0x28) != 5)) {
        pNVar13 = prvTidyFindHEAD((TidyDocImpl *)tdoc);
        prvTidyVerifyHTTPEquiv((TidyDocImpl *)tdoc,pNVar13);
      }
      BVar10 = prvTidyCheckNodeIntegrity((Node *)tdoc);
      if (BVar10 == no) {
        (**(code **)(**(long **)(tdoc + 0xcea) + 0x18))
                  (*(long **)(tdoc + 0xcea),"\nPanic - tree has lost its integrity\n");
      }
      pNVar13 = prvTidyFindDocType((TidyDocImpl *)tdoc);
      __s1 = *(char **)(tdoc + 0x2e);
      if (__s1 == (char *)0x0) {
        __s1 = tidyOptGetCurrPick(tdoc,TidyDoctypeMode);
      }
      if (__s1 != (char *)0x0) {
        iVar11 = strcmp(__s1,"html5");
        if (iVar11 == 0) {
          prvTidyCheckHTML5((TidyDocImpl *)tdoc,(Node *)tdoc);
        }
      }
      if (pNVar13 != (Node *)0x0) {
        pAVar14 = prvTidyGetAttrByName(pNVar13,"PUBLIC");
        if ((pAVar14 != (AttVal *)0x0) && (pAVar14->value != (tmbstr)0x0)) {
          if (*(long *)(tdoc + 0xcf4) != 0) {
            (**(code **)(**(long **)(tdoc + 0xcea) + 0x10))();
          }
          ptVar15 = prvTidytmbstrdup(*(TidyAllocator **)(tdoc + 0xcea),pAVar14->value);
          *(tmbstr *)(tdoc + 0xcf4) = ptVar15;
        }
      }
      if (*(long *)(tdoc + 6) != 0) {
        if ((iVar5 != 0) && (*(int *)(*(long *)(tdoc + 0x1a) + 0x1c) != 0)) {
          pNVar13 = prvTidyFindDocType((TidyDocImpl *)tdoc);
          if (pNVar13 != (Node *)0x0) {
            prvTidyRemoveNode(pNVar13);
          }
        }
        if ((iVar5 == 0) && (iVar7 != 0)) {
          prvTidySetXHTMLDocType((TidyDocImpl *)tdoc);
          BVar10 = yes;
        }
        else {
          prvTidyFixDocType((TidyDocImpl *)tdoc);
          BVar10 = no;
        }
        prvTidyFixAnchors((TidyDocImpl *)tdoc,(Node *)tdoc,wantName,yes);
        prvTidyFixXhtmlNamespace((TidyDocImpl *)tdoc,BVar10);
        prvTidyFixLanguageInformation((TidyDocImpl *)tdoc,(Node *)tdoc,BVar10,yes);
        if (iVar9 != 0) {
          prvTidyAddGenerator((TidyDocImpl *)tdoc);
        }
      }
      if ((iVar6 != 0) && (iVar8 != 0)) {
        prvTidyFixXmlDecl((TidyDocImpl *)tdoc);
      }
    }
    uVar12 = 2;
    if ((tdoc[0xcdf]._opaque == 0) && (uVar12 = 1, tdoc[0xce0]._opaque == 0)) {
      uVar12 = (uint)(tdoc[0xce1]._opaque != 0);
    }
    return uVar12;
  }
  return -0x16;
}

Assistant:

int TIDY_CALL        tidyCleanAndRepair( TidyDoc tdoc )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl )
      return tidyDocCleanAndRepair( impl );
    return -EINVAL;
}